

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O3

void printAddrMode7Operand(MCInst *MI,uint OpNum,SStream *O)

{
  uint8_t *puVar1;
  cs_struct *pcVar2;
  cs_detail *pcVar3;
  uint uVar4;
  MCOperand *op;
  char *s;
  
  op = MCInst_getOperand(MI,OpNum);
  SStream_concat0(O,"[");
  set_mem_access(MI,true);
  pcVar2 = MI->csh;
  uVar4 = MCOperand_getReg(op);
  s = (*pcVar2->get_regname)(uVar4);
  SStream_concat0(O,s);
  if (MI->csh->detail != CS_OPT_OFF) {
    uVar4 = MCOperand_getReg(op);
    pcVar3 = MI->flat_insn->detail;
    *(uint *)(pcVar3->groups + (ulong)((uint)(pcVar3->field_6).arm.op_count * 0x30) + 0x45) = uVar4;
  }
  SStream_concat0(O,"]");
  if (MI->csh->detail == CS_OPT_ON) {
    MI->csh->doing_mem = false;
    puVar1 = &(MI->flat_insn->detail->field_6).arm.op_count;
    *puVar1 = *puVar1 + '\x01';
  }
  return;
}

Assistant:

static void printAddrMode7Operand(MCInst *MI, unsigned OpNum, SStream *O)
{
	MCOperand *MO1 = MCInst_getOperand(MI, OpNum);
	SStream_concat0(O, "[");
	set_mem_access(MI, true);
	printRegName(MI->csh, O, MCOperand_getReg(MO1));
	if (MI->csh->detail)
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].mem.base = MCOperand_getReg(MO1);
	SStream_concat0(O, "]");
	set_mem_access(MI, false);
}